

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCPUWarmup.cpp
# Opt level: O0

float tcu::floatMedian<float,5>(float (*v) [5])

{
  int local_2c;
  float local_28;
  int i;
  float temp [5];
  float (*v_local) [5];
  
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    (&local_28)[local_2c] = (*v)[local_2c];
  }
  unique0x10000086 = v;
  std::sort<float*>(&local_28,temp + 3);
  return temp[0];
}

Assistant:

static inline float floatMedian (const T (&v)[Size])
{
	T temp[Size];
	for (int i = 0; i < Size; i++)
		temp[i] = v[i];

	std::sort(DE_ARRAY_BEGIN(temp), DE_ARRAY_END(temp));

	return Size % 2 == 0
		   ? 0.5f * ((float)temp[Size/2-1] + (float)temp[Size/2])
		   : (float)temp[Size/2];
}